

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O3

void __thiscall kratos::SwitchStmt::set_parent(SwitchStmt *this,IRNode *parent)

{
  _Rb_tree_node_base *p_Var1;
  
  (this->super_Stmt).parent_ = parent;
  for (p_Var1 = (this->body_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->body_)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
    (**(code **)(*(long *)p_Var1[1]._M_left + 0x38))(p_Var1[1]._M_left,this);
  }
  return;
}

Assistant:

void SwitchStmt::set_parent(IRNode *parent) {
    Stmt::set_parent(parent);
    for (auto &iter : body_) {
        iter.second->set_parent(this);
    }
}